

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_calc_usb_mul_h(DisasContext_conflict14 *ctx,TCGv_i32 arg_low,TCGv_i32 arg_high)

{
  TCGTemp *ts;
  TCGArg TVar1;
  uintptr_t o;
  TCGv_i32 pTVar2;
  uintptr_t o_1;
  
  ts = tcg_temp_new_internal_tricore((TCGContext_conflict9 *)ctx,TCG_TYPE_I32,false);
  pTVar2 = arg_low + (long)ctx;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_add_i32,(TCGArg)ts,(TCGArg)pTVar2,
                      (TCGArg)pTVar2);
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_xor_i32,(TCGArg)ts,(TCGArg)ts,
                      (TCGArg)pTVar2);
  pTVar2 = arg_high + (long)ctx;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_add_i32,
                      (long)&(ctx->base).tb + ctx[0x1c6].features,(TCGArg)pTVar2,(TCGArg)pTVar2);
  TVar1 = (long)&(ctx->base).tb + ctx[0x1c6].features;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_xor_i32,TVar1,TVar1,(TCGArg)pTVar2);
  TVar1 = (long)&(ctx->base).tb + ctx[0x1c6].features;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_or_i32,TVar1,TVar1,(TCGArg)ts);
  TVar1 = (long)&(ctx->base).tb + (long)&(ctx[0x1c6].uc)->arch;
  tcg_gen_op3_tricore((TCGContext_conflict9 *)ctx,INDEX_op_or_i32,TVar1,TVar1,
                      (long)&(ctx->base).tb + ctx[0x1c6].features);
  tcg_gen_op2_tricore((TCGContext_conflict9 *)ctx,INDEX_op_movi_i32,
                      (long)&(ctx->base).tb + *(long *)&ctx[0x1c6].opcode,0);
  tcg_temp_free_internal_tricore((TCGContext_conflict9 *)ctx,ts);
  return;
}

Assistant:

static void gen_calc_usb_mul_h(DisasContext *ctx, TCGv arg_low, TCGv arg_high)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    /* calc AV bit */
    tcg_gen_add_tl(tcg_ctx, temp, arg_low, arg_low);
    tcg_gen_xor_tl(tcg_ctx, temp, temp, arg_low);
    tcg_gen_add_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, arg_high, arg_high);
    tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_AV, arg_high);
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_AV, tcg_ctx->cpu_PSW_AV, temp);
    /* calc SAV bit */
    tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_SAV, tcg_ctx->cpu_PSW_AV);
    tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_PSW_V, 0);
    tcg_temp_free(tcg_ctx, temp);
}